

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

void __thiscall IDisk::CreateSingleTrackFromMultiRevolutions(IDisk *this,int side,int track)

{
  Revolution *pRVar1;
  void *pvVar2;
  int iVar3;
  uchar *__s;
  MFMTrack *pMVar4;
  int *piVar5;
  MFMTrack *pMVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  MFMTrack **ppMVar10;
  
  ppMVar10 = &this->side_[side].tracks;
  if ((*ppMVar10)[track].nb_revolutions == 1) {
    pMVar4 = *ppMVar10 + track;
    pRVar1 = pMVar4->revolution;
    pMVar4->bitfield = pRVar1->bitfield;
    pMVar4->size = pRVar1->size;
    piVar5 = &pRVar1[-1].track_info.full_size_;
    lVar8 = *(long *)&pRVar1[-1].track_info.full_size_;
    if (lVar8 != 0) {
      lVar7 = lVar8 * 0x30;
      do {
        pvVar2 = *(void **)((long)pRVar1 + lVar7 + -0x20);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,*(long *)((long)pRVar1 + lVar7 + -0x10) - (long)pvVar2);
        }
        lVar7 = lVar7 + -0x30;
      } while (lVar7 != 0);
    }
LAB_00163c9b:
    operator_delete__(piVar5,lVar8 * 0x30 + 8);
    pMVar6 = *ppMVar10;
  }
  else {
    iVar3 = (*this->_vptr_IDisk[0x15])();
    pMVar6 = *ppMVar10;
    pMVar4 = pMVar6 + track;
    if ((char)iVar3 == '\0') {
      if (pMVar6[track].nb_revolutions != 0) {
        lVar8 = 0;
        uVar9 = 0;
        do {
          pvVar2 = *(void **)((long)&pMVar4->revolution->bitfield + lVar8);
          if (pvVar2 != (void *)0x0) {
            operator_delete__(pvVar2);
            pMVar6 = *ppMVar10;
          }
          uVar9 = uVar9 + 1;
          pMVar4 = pMVar6 + track;
          lVar8 = lVar8 + 0x30;
        } while (uVar9 < pMVar6[track].nb_revolutions);
      }
      pRVar1 = pMVar4->revolution;
      if (pRVar1 != (Revolution *)0x0) {
        lVar8 = *(long *)&pRVar1[-1].track_info.full_size_;
        if (lVar8 != 0) {
          lVar7 = lVar8 * 0x30;
          do {
            pvVar2 = *(void **)((long)pRVar1 + lVar7 + -0x20);
            if (pvVar2 != (void *)0x0) {
              operator_delete(pvVar2,*(long *)((long)pRVar1 + lVar7 + -0x10) - (long)pvVar2);
            }
            lVar7 = lVar7 + -0x30;
          } while (lVar7 != 0);
        }
        operator_delete__(&pRVar1[-1].track_info.full_size_,lVar8 * 0x30 + 8);
        pMVar6 = *ppMVar10;
      }
      pMVar6[track].revolution = (Revolution *)0x0;
      pMVar6[track].nb_revolutions = 0;
      pMVar6[track].bitfield = (uchar *)0x0;
      pMVar6[track].size = 0;
      goto LAB_00163d6c;
    }
    if (pMVar6[track].nb_revolutions != 0) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        pvVar2 = *(void **)((long)&pMVar4->revolution->bitfield + lVar8);
        if (pvVar2 != (void *)0x0) {
          operator_delete__(pvVar2);
          pMVar6 = *ppMVar10;
        }
        uVar9 = uVar9 + 1;
        pMVar4 = pMVar6 + track;
        lVar8 = lVar8 + 0x30;
      } while (uVar9 < pMVar6[track].nb_revolutions);
    }
    pRVar1 = pMVar4->revolution;
    if (pRVar1 != (Revolution *)0x0) {
      piVar5 = &pRVar1[-1].track_info.full_size_;
      lVar8 = *(long *)&pRVar1[-1].track_info.full_size_;
      if (lVar8 != 0) {
        lVar7 = lVar8 * 0x30;
        do {
          pvVar2 = *(void **)((long)pRVar1 + lVar7 + -0x20);
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,*(long *)((long)pRVar1 + lVar7 + -0x10) - (long)pvVar2);
          }
          lVar7 = lVar7 + -0x30;
        } while (lVar7 != 0);
      }
      goto LAB_00163c9b;
    }
  }
  pMVar6[track].nb_revolutions = 0;
  pMVar6[track].revolution = (Revolution *)0x0;
LAB_00163d6c:
  if (pMVar6[track].bitfield == (uchar *)0x0) {
    pMVar6[track].size = 0x40000;
    __s = (uchar *)operator_new__(0x40000);
    pMVar6[track].bitfield = __s;
    memset(__s,4,0x40000);
    return;
  }
  return;
}

Assistant:

void IDisk::CreateSingleTrackFromMultiRevolutions(int side, int track)
{
   // Only one revolution : Nothing else to add...
   if (side_[side].tracks[track].nb_revolutions == 1)
   {
      side_[side].tracks[track].bitfield = side_[side].tracks[track].revolution[0].bitfield;
      side_[side].tracks[track].size = side_[side].tracks[track].revolution[0].size;

      delete[]side_[side].tracks[track].revolution;
      side_[side].tracks[track].nb_revolutions = 0;
      side_[side].tracks[track].revolution = nullptr;
   }
   else
   {
      // Otherwise
      Track track_buffer;

      if (!CreateTrackFromRevolution(side, track))
      {
         for (unsigned int rev = 0; rev < side_[side].tracks[track].nb_revolutions; rev++)
         {
            delete[]side_[side].tracks[track].revolution[rev].bitfield;
         }
         delete[]side_[side].tracks[track].revolution;
         side_[side].tracks[track].revolution = nullptr;
         side_[side].tracks[track].nb_revolutions = 0;
         side_[side].tracks[track].bitfield = nullptr;
         side_[side].tracks[track].size = 0;
      }
      else
      {
         for (unsigned int rev = 0; rev < side_[side].tracks[track].nb_revolutions; rev++)
         {
            delete[]side_[side].tracks[track].revolution[rev].bitfield;
         }
         delete[]side_[side].tracks[track].revolution;
         side_[side].tracks[track].nb_revolutions = 0;
         side_[side].tracks[track].revolution = nullptr;
      }
   }
   // Now, just clear the Revolution structure.
   if (side_[side].tracks[track].bitfield == nullptr)
   {
      // Set a default (unformatted) track
      side_[side].tracks[track].size = DEFAULT_TRACK_SIZE * 16;
      side_[side].tracks[track].bitfield = new unsigned char[DEFAULT_TRACK_SIZE * 16];
      memset(side_[side].tracks[track].bitfield, BIT_WEAK, DEFAULT_TRACK_SIZE * 16);
   }
}